

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromosome.h
# Opt level: O1

void __thiscall tsp::Chromosome::Chromosome(Chromosome *this,Region *region)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  iterator __position;
  uint uVar3;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  p_Var1 = &(this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->region).mapOfCities._M_t._M_impl = 0;
  *(undefined8 *)&(this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48 = (void *)0x0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->values,&local_48);
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  uVar2 = (uint)(region->mapOfCities)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar2 != 0) {
    uVar3 = 1;
    do {
      local_48 = (void *)CONCAT44(local_48._4_4_,uVar3);
      __position._M_current =
           (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->values,__position,(int *)&local_48);
      }
      else {
        *__position._M_current = uVar3;
        (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = __position._M_current + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 <= uVar2);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_tsp::City>,_std::_Select1st<std::pair<const_int,_tsp::City>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tsp::City>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_tsp::City>,_std::_Select1st<std::pair<const_int,_tsp::City>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tsp::City>_>_>
               *)this,(_Rb_tree<int,_std::pair<const_int,_tsp::City>,_std::_Select1st<std::pair<const_int,_tsp::City>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tsp::City>_>_>
                       *)region);
  return;
}

Assistant:

Chromosome::Chromosome(tsp::Region &region) {
        this->values = std::vector<int>();
        uint size = region.countCities();

        for (uint v = 1; v <= size; v++) {
            this->values.push_back(v);
        }

        this->region = region;
    }